

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O1

bool helics::changeDetected
               (defV *prevValue,
               vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val,
               double deltaV)

{
  pointer pcVar1;
  variant_alternative_t<5UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar2;
  long lVar3;
  long lVar4;
  byte unaff_BPL;
  long lVar5;
  ulong uVar6;
  double dVar7;
  
  if ((prevValue->
      super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ).
      super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
      .
      super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
      .
      super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
      .
      super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
      .
      super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
      ._M_index == '\x05') {
    pvVar2 = std::
             get<5ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (prevValue);
    lVar3 = (long)(val->
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(val->
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    lVar5 = (long)(pvVar2->
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(pvVar2->
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    if (lVar3 == lVar5) {
      pcVar1 = (val->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      unaff_BPL = (val->
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish != pcVar1;
      if ((bool)unaff_BPL) {
        dVar7 = cabs(*(double *)
                      ((pvVar2->
                       super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)->_M_value -
                     *(double *)pcVar1->_M_value);
        if (dVar7 <= deltaV) {
          uVar6 = 0;
          lVar4 = 0x18;
          do {
            uVar6 = uVar6 + 1;
            pcVar1 = (val->
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            unaff_BPL = uVar6 < (ulong)((long)(val->
                                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)pcVar1 >> 4);
            if (!(bool)unaff_BPL) break;
            dVar7 = cabs(*(double *)
                          (((pvVar2->
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar4 + -8) -
                         *(double *)(pcVar1->_M_value + lVar4 + -8));
            lVar4 = lVar4 + 0x10;
          } while (dVar7 <= deltaV);
        }
      }
    }
    if (lVar3 == lVar5) goto LAB_0028f0b0;
  }
  unaff_BPL = 1;
LAB_0028f0b0:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool changeDetected(const defV& prevValue,
                    const std::vector<std::complex<double>>& val,
                    double deltaV)
{
    if (prevValue.index() == complex_vector_loc) {
        const auto& prevV = std::get<std::vector<std::complex<double>>>(prevValue);
        if (val.size() == prevV.size()) {
            for (size_t ii = 0; ii < val.size(); ++ii) {
                if (std::abs(prevV[ii] - val[ii]) > deltaV) {
                    return true;
                }
            }
            return false;
        }
    }
    return true;
}